

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

int os_file_names_equal(char *a,char *b)

{
  int iVar1;
  size_t sVar2;
  char *p;
  char *p_00;
  size_t lenb;
  size_t lena;
  size_t local_40;
  size_t local_38;
  
  sVar2 = strlen(a);
  p_00 = a + sVar2;
  sVar2 = strlen(b);
  p = b + sVar2;
  do {
    p_00 = prev_path_ele(a,p_00,&local_38);
    p = prev_path_ele(b,p,&local_40);
    if ((p_00 == (char *)0x0) || (p == (char *)0x0)) {
      return (uint)(p_00 == p);
    }
  } while ((local_38 == local_40) && (iVar1 = bcmp(p_00,p,local_38), iVar1 == 0));
  return 0;
}

Assistant:

int os_file_names_equal(const char *a, const char *b)
{
    /* start at the end of each name and work backwards */
    const char *pa = a + strlen(a), *pb = b + strlen(b);

    /* keep going until we reach the start of one or the other path */
    for (;;)
    {
        size_t lena, lenb;

        /* get the next earlier element of each path */
        pa = prev_path_ele(a, pa, &lena);
        pb = prev_path_ele(b, pb, &lenb);

        /* if one or the other ran out, we're done */
        if (pa == 0 || pb == 0)
        {
            /* the paths match if they ran out at the same time */
            return pa == pb;
        }

        /* if the two elements don't match, return unequal */
        if (lena != lenb || fname_memcmp(pa, pb, lena) != 0)
            return FALSE;
    }
}